

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashsu::Hash32(char *s,size_t len)

{
  undefined1 auVar1 [16];
  __m128i x_00;
  __m128i x_01;
  __m128i x_02;
  __m128i x_03;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  undefined4 uVar22;
  int iVar23;
  undefined4 uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  undefined4 uVar28;
  longlong (*palVar29) [2];
  ulong uVar30;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong (*in_RSI) [2];
  longlong (*in_RDI) [2];
  longlong lVar32;
  longlong lVar33;
  longlong lVar34;
  longlong lVar35;
  __m128i alVar36;
  __m128i x_04;
  __m128i x_05;
  __m128i x_06;
  __m128i x_07;
  __m128i x_08;
  __m128i x_09;
  __m128i x_10;
  __m128i x_11;
  __m128i x_12;
  __m128i x_13;
  __m128i x_14;
  __m128i x_15;
  __m128i x_16;
  __m128i x_17;
  __m128i x_18;
  __m128i x_19;
  __m128i x_20;
  __m128i x_21;
  __m128i x_22;
  __m128i x_23;
  __m128i x_24;
  __m128i x_25;
  __m128i x_26;
  __m128i x_27;
  __m128i x_28;
  __m128i x_29;
  __m128i x_30;
  __m128i x_31;
  __m128i x_32;
  __m128i x_33;
  __m128i x_34;
  __m128i x_35;
  __m128i x_36;
  __m128i x_37;
  __m128i x_38;
  __m128i x_39;
  __m128i x_40;
  __m128i x_41;
  __m128i x_42;
  __m128i x_43;
  __m128i x_44;
  __m128i x_45;
  __m128i x_46;
  __m128i x_47;
  __m128i x_48;
  __m128i x_49;
  __m128i x_50;
  __m128i x_51;
  __m128i x_52;
  __m128i x_53;
  __m128i x_54;
  __m128i x_55;
  __m128i x_56;
  __m128i x_57;
  __m128i x_58;
  __m128i x_59;
  __m128i x_60;
  __m128i x_61;
  __m128i x_62;
  __m128i x_63;
  __m128i x_64;
  __m128i x_65;
  __m128i x_66;
  __m128i x_67;
  __m128i x_68;
  __m128i x_69;
  __m128i x_70;
  __m128i x_71;
  __m128i x_72;
  __m128i x_73;
  __m128i x_74;
  __m128i x_75;
  __m128i x_76;
  __m128i x_77;
  __m128i x_78;
  __m128i x_79;
  __m128i x_80;
  __m128i x_81;
  __m128i x_82;
  __m128i x_83;
  __m128i x_84;
  __m128i y_00;
  __m128i y_01;
  __m128i y_02;
  __m128i y_03;
  __m128i y_04;
  __m128i y_05;
  __m128i y_06;
  __m128i y_07;
  __m128i y_08;
  __m128i y_09;
  __m128i y_10;
  __m128i y_11;
  __m128i y_12;
  __m128i y_13;
  __m128i y_14;
  __m128i y_15;
  __m128i y_16;
  __m128i y_17;
  __m128i y_18;
  __m128i y_19;
  __m128i y_20;
  __m128i y_21;
  __m128i y_22;
  __m128i y_23;
  __m128i y_24;
  __m128i y_25;
  __m128i y_26;
  __m128i y_27;
  __m128i y_28;
  __m128i y_29;
  __m128i y_30;
  __m128i y_31;
  __m128i y_32;
  __m128i y_33;
  __m128i y_34;
  __m128i y_35;
  __m128i y_36;
  __m128i y_37;
  __m128i y_38;
  __m128i y_39;
  __m128i y_40;
  __m128i y_41;
  __m128i y_42;
  __m128i y_43;
  __m128i y_44;
  __m128i y_45;
  __m128i y_46;
  __m128i y_47;
  __m128i y_48;
  __m128i y_49;
  __m128i y_50;
  __m128i y_51;
  __m128i y_52;
  __m128i y_53;
  __m128i y_54;
  __m128i y_55;
  __m128i y_56;
  __m128i y_57;
  __m128i y_58;
  __m128i y_59;
  __m128i y_60;
  __m128i y_61;
  __m128i y_62;
  __m128i y_63;
  __m128i y_64;
  __m128i y_65;
  __m128i y_66;
  __m128i y_67;
  __m128i y_68;
  __m128i y_69;
  __m128i y_70;
  __m128i y_71;
  __m128i y_72;
  __m128i y_73;
  __m128i y_74;
  __m128i y_75;
  __m128i y_76;
  uint32_t o;
  uint32_t z;
  uint32_t y;
  uint32_t x;
  __m128i buf [4];
  __m128i be_2;
  __m128i e_2;
  __m128i d_3;
  __m128i c_3;
  __m128i b_3;
  __m128i a_3;
  __m128i be_1;
  __m128i e_1;
  __m128i d_2;
  __m128i c_2;
  __m128i b_2;
  __m128i a_2;
  size_t iters;
  __m128i be;
  __m128i e;
  __m128i d_1;
  __m128i c_1;
  __m128i b_1;
  __m128i a_1;
  __m128i q;
  __m128i k;
  __m128i f;
  __m128i g;
  __m128i h;
  __m128i cc2;
  __m128i cc1;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t seed;
  longlong in_stack_fffffffffffffaa8;
  uint32_t in_stack_fffffffffffffac4;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  uint32_t local_4c0;
  uint32_t local_4bc;
  longlong local_4a8;
  longlong lStack_4a0;
  longlong local_498;
  longlong lStack_490;
  longlong local_488;
  longlong lStack_480;
  longlong local_478;
  longlong lStack_470;
  longlong local_468;
  longlong lStack_460;
  longlong local_458;
  longlong lStack_450;
  longlong local_448;
  longlong lStack_440;
  longlong local_438;
  longlong lStack_430;
  longlong local_428;
  longlong lStack_420;
  longlong local_418;
  longlong lStack_410;
  longlong local_408;
  longlong lStack_400;
  longlong local_3f8;
  longlong lStack_3f0;
  longlong local_3e8;
  longlong lStack_3e0;
  longlong local_3d8;
  longlong lStack_3d0;
  longlong local_3c8;
  longlong lStack_3c0;
  longlong local_3b8;
  longlong lStack_3b0;
  ulong local_3a0;
  longlong local_398;
  longlong lStack_390;
  longlong local_388;
  longlong lStack_380;
  longlong local_378;
  longlong lStack_370;
  longlong local_368;
  longlong lStack_360;
  longlong local_358;
  longlong lStack_350;
  longlong local_348;
  longlong lStack_340;
  longlong local_338 [2];
  longlong local_328;
  longlong lStack_320;
  longlong local_318;
  longlong lStack_310;
  longlong local_308;
  longlong lStack_300;
  longlong local_2f8;
  longlong lStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  uint32_t local_2b8;
  undefined4 local_2b4;
  longlong (*local_2b0) [2];
  longlong (*local_2a8) [2];
  uint32_t local_2a0;
  uint32_t local_294;
  undefined4 local_290;
  uint32_t local_28c;
  int local_288;
  uint32_t local_284;
  undefined4 local_280;
  uint32_t local_27c;
  int local_278;
  uint32_t local_274;
  int local_270;
  uint32_t local_26c;
  int local_268;
  uint32_t local_264;
  undefined4 local_260;
  uint32_t local_25c;
  int local_258;
  uint32_t local_254;
  undefined4 local_250;
  uint32_t local_24c;
  int local_248;
  uint32_t local_244;
  uint32_t local_240;
  uint32_t local_23c;
  uint32_t local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  uint local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  longlong local_208;
  longlong lStack_200;
  longlong local_1f8;
  longlong lStack_1f0;
  longlong local_1e8;
  longlong lStack_1e0;
  longlong local_1d8;
  longlong lStack_1d0;
  longlong local_1c8;
  longlong lStack_1c0;
  longlong local_1b8;
  longlong lStack_1b0;
  longlong local_1a8;
  longlong lStack_1a0;
  longlong local_198;
  longlong lStack_190;
  longlong local_188;
  longlong lStack_180;
  longlong local_178;
  longlong lStack_170;
  longlong local_168;
  longlong lStack_160;
  longlong local_158;
  longlong lStack_150;
  longlong local_148;
  longlong lStack_140;
  longlong local_138;
  longlong lStack_130;
  longlong local_128;
  longlong lStack_120;
  longlong local_118;
  longlong lStack_110;
  longlong local_108;
  longlong lStack_100;
  longlong local_f8;
  longlong lStack_f0;
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  longlong local_88 [2];
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined1 local_48 [16];
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  undefined1 local_28 [16];
  uint local_10;
  uint local_c;
  uint local_8;
  uint local_4;
  ulong uVar31;
  
  local_2b4 = 0x51;
  if (in_RSI < (longlong (*) [2])0x19) {
    if (in_RSI < (longlong (*) [2])0xd) {
      if (in_RSI < (longlong (*) [2])0x5) {
        local_4bc = farmhashmk::Hash32Len0to4
                              ((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)
                               ,CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                               in_stack_fffffffffffffac4);
      }
      else {
        local_4bc = farmhashmk::Hash32Len5to12
                              ((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)
                               ,CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                               in_stack_fffffffffffffac4);
      }
      local_4c0 = local_4bc;
    }
    else {
      local_4c0 = farmhashmk::Hash32Len13to24
                            ((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                             CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                             in_stack_fffffffffffffac4);
    }
    local_2a0 = local_4c0;
  }
  else {
    local_2b0 = in_RSI;
    local_2a8 = in_RDI;
    if (in_RSI < (longlong (*) [2])0x28) {
      local_2b8 = (uint32_t)in_RSI;
      local_2bc = -0x4a380c7d;
      local_2c0 = local_2b8 + -0x4a380c7d;
      uVar19 = util::Fetch32((char *)((long)in_RSI[-1] + (long)((long)*in_RDI + 0xc)));
      local_2b8 = uVar19 + local_2b8;
      uVar19 = util::Fetch32((char *)((long)local_2b0[-2] + (long)((long)*local_2a8 + 0xc)));
      local_2bc = uVar19 + local_2bc;
      uVar19 = util::Fetch32((char *)((long)local_2b0[-1] + (long)*local_2a8));
      local_2c0 = uVar19 + local_2c0;
      local_2c4 = local_2b8;
      local_2b8 = util::Rotate32(0,0x208d88);
      local_228 = local_2c0;
      local_22c = local_2c4;
      crc32(local_2c0,local_2c4);
      util::Mur(0,0x208dd6);
      local_2b8 = util::Mur(0,0x208de4);
      uVar19 = util::Fetch32((char *)((long)local_2b0[-1] + (long)((long)*local_2a8 + 4)));
      local_2b8 = uVar19 + local_2b8;
      uVar19 = util::Fetch32((char *)((long)local_2b0[-1] + (long)(*local_2a8 + 1)));
      local_2bc = uVar19 + local_2bc;
      local_2c4 = local_2b8 + local_2c4;
      local_2b8 = local_2c4 + local_2b8;
      uVar19 = util::Mur(0,0x208e76);
      local_2bc = uVar19 * 0x1b873593;
      local_234 = local_2bc + local_2c0;
      local_230 = local_2b8;
      local_2b8 = crc32(local_2b8,local_234);
      local_2a0 = farmhashmk::Hash32Len13to24
                            ((char *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                             CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8),
                             in_stack_fffffffffffffac4);
      local_2a0 = local_2a0 + local_2bc;
    }
    else {
      local_20c = 0xcc9e2d51;
      local_cc = 0xcc9e2d51;
      local_d0 = 0xcc9e2d51;
      local_d4 = 0xcc9e2d51;
      local_d8 = 0xcc9e2d51;
      auVar1 = vpinsrd_avx(ZEXT416(0xcc9e2d51),0xcc9e2d51,1);
      auVar1 = vpinsrd_avx(auVar1,0xcc9e2d51,2);
      local_e8 = vpinsrd_avx(auVar1,0xcc9e2d51,3);
      local_2d8 = local_e8._0_8_;
      uStack_2d0 = local_e8._8_8_;
      local_210 = 0x1b873593;
      local_ac = 0x1b873593;
      local_b0 = 0x1b873593;
      local_b4 = 0x1b873593;
      local_b8 = 0x1b873593;
      auVar1 = vpinsrd_avx(ZEXT416(0x1b873593),0x1b873593,1);
      auVar1 = vpinsrd_avx(auVar1,0x1b873593,2);
      local_c8 = vpinsrd_avx(auVar1,0x1b873593,3);
      local_2e8 = local_c8._0_8_;
      uStack_2e0 = local_c8._8_8_;
      local_214 = 0x51;
      local_8c = 0x51;
      local_90 = 0x51;
      local_94 = 0x51;
      local_98 = 0x51;
      auVar1 = vpinsrd_avx(ZEXT416(0x51),0x51,1);
      auVar1 = vpinsrd_avx(auVar1,0x51,2);
      local_a8 = vpinsrd_avx(auVar1,0x51,3);
      local_2f8 = local_a8._0_8_;
      lStack_2f0 = local_a8._8_8_;
      local_218 = 0xbe0c56a1;
      local_6c = 0xbe0c56a1;
      local_70 = 0xbe0c56a1;
      local_74 = 0xbe0c56a1;
      local_78 = 0xbe0c56a1;
      auVar1 = vpinsrd_avx(ZEXT416(0xbe0c56a1),0xbe0c56a1,1);
      auVar1 = vpinsrd_avx(auVar1,0xbe0c56a1,2);
      local_338 = (longlong  [2])vpinsrd_avx(auVar1,0xbe0c56a1,3);
      local_88[0] = local_338[0];
      local_88[1] = local_338[1];
      local_308 = local_88[0];
      lStack_300 = local_88[1];
      local_318 = local_88[0];
      lStack_310 = local_88[1];
      local_21c = 0xe6546b64;
      local_4c = 0xe6546b64;
      local_50 = 0xe6546b64;
      local_54 = 0xe6546b64;
      local_58 = 0xe6546b64;
      auVar1 = vpinsrd_avx(ZEXT416(0xe6546b64),0xe6546b64,1);
      auVar1 = vpinsrd_avx(auVar1,0xe6546b64,2);
      local_68 = vpinsrd_avx(auVar1,0xe6546b64,3);
      local_328 = local_68._0_8_;
      lStack_320 = local_68._8_8_;
      local_88 = local_338;
      if (in_RSI < (longlong (*) [2])0x50) {
        lVar32 = local_68._0_8_;
        lVar34 = local_68._8_8_;
        Fetch128((char *)in_RDI);
        local_348 = lVar32;
        lStack_340 = lVar34;
        Fetch128((char *)(local_2a8 + 1));
        local_358 = lVar32;
        lStack_350 = lVar34;
        Fetch128((char *)((long)*local_2a8 + ((ulong)((long)local_2b0[-1] + 1) >> 1)));
        local_368 = lVar32;
        lStack_360 = lVar34;
        Fetch128((char *)((long)*local_2b0 + (long)local_2a8[-2]));
        in_RDI = (longlong (*) [2])((long)*local_2b0 + (long)local_2a8[-1]);
        palVar29 = local_2b0;
        local_378 = lVar32;
        lStack_370 = lVar34;
        alVar36 = Fetch128((char *)in_RDI);
        y_00[0] = alVar36[1];
        x_04[1] = (longlong)in_RSI;
        x_04[0] = (longlong)in_RDI;
        y_00[1] = (longlong)palVar29;
        local_388 = lVar32;
        lStack_380 = lVar34;
        alVar36 = Add(x_04,y_00);
        y_01[0] = alVar36[1];
        x_05[1] = (longlong)in_RSI;
        x_05[0] = (longlong)in_RDI;
        y_01[1] = (longlong)palVar29;
        Add(x_05,y_01);
        local_338[1] = lStack_300;
        local_338[0] = local_308;
        x_06[1] = (longlong)in_RSI;
        x_06[0] = (longlong)in_RDI;
        alVar36 = Shuffle0321(x_06);
        y_02[0] = alVar36[1];
        x_07[1] = (longlong)in_RSI;
        x_07[0] = (longlong)in_RDI;
        y_02[1] = (longlong)palVar29;
        alVar36 = Add(x_07,y_02);
        lVar34 = lStack_350;
        lVar32 = local_358;
        y_03[0] = alVar36[1];
        x_08[1] = (longlong)in_RSI;
        x_08[0] = (longlong)in_RDI;
        y_03[1] = (longlong)palVar29;
        alVar36 = Mul(x_08,y_03);
        y_04[0] = alVar36[1];
        x_09[1] = (longlong)in_RSI;
        x_09[0] = (longlong)in_RDI;
        y_04[1] = (longlong)palVar29;
        alVar36 = Add(x_09,y_04);
        y_05[0] = alVar36[1];
        x_10[1] = (longlong)in_RSI;
        x_10[0] = (longlong)in_RDI;
        y_05[1] = (longlong)palVar29;
        local_398 = lVar32;
        lStack_390 = lVar34;
        alVar36 = Add(x_10,y_05);
        y_06[0] = alVar36[1];
        x_11[1] = (longlong)in_RSI;
        x_11[0] = (longlong)in_RDI;
        y_06[1] = (longlong)palVar29;
        alVar36 = Add(x_11,y_06);
        lVar34 = lStack_320;
        lVar32 = local_328;
        y_07[0] = alVar36[1];
        x_12[1] = (longlong)in_RSI;
        x_12[0] = (longlong)in_RDI;
        y_07[1] = (longlong)palVar29;
        Mul(x_12,y_07);
        x_00[1] = in_stack_fffffffffffffaa8;
        x_00[0] = 0x209342;
        alVar36 = Rol17(x_00);
        y_08[0] = alVar36[1];
        x_13[1] = (longlong)in_RSI;
        x_13[0] = (longlong)in_RDI;
        y_08[1] = (longlong)palVar29;
        alVar36 = Mul(x_13,y_08);
        y_09[0] = alVar36[1];
        x_14[1] = (longlong)in_RSI;
        x_14[0] = (longlong)in_RDI;
        y_09[1] = (longlong)palVar29;
        Xor(x_14,y_09);
        x_01[1] = in_stack_fffffffffffffaa8;
        x_01[0] = 0x209363;
        Rol19(x_01);
        x_02[1] = in_stack_fffffffffffffaa8;
        x_02[0] = 0x209368;
        alVar36 = Mul5(x_02);
        y_10[0] = alVar36[1];
        x_15[1] = (longlong)in_RSI;
        x_15[0] = (longlong)in_RDI;
        y_10[1] = (longlong)palVar29;
        alVar36 = Add(x_15,y_10);
        y_11[0] = alVar36[1];
        x_16[1] = (longlong)in_RSI;
        x_16[0] = (longlong)in_RDI;
        y_11[1] = (longlong)palVar29;
        alVar36 = Add(x_16,y_11);
        y_12[0] = alVar36[1];
        local_118 = local_308;
        lStack_110 = lStack_300;
        local_128 = local_318;
        lStack_120 = lStack_310;
        auVar16._8_8_ = lStack_300;
        auVar16._0_8_ = local_308;
        auVar15._8_8_ = lStack_310;
        auVar15._0_8_ = local_318;
        vpshufb_avx(auVar16,auVar15);
        x_17[1] = (longlong)in_RSI;
        x_17[0] = (longlong)in_RDI;
        y_12[1] = (longlong)palVar29;
        local_2f8 = lVar32;
        lStack_2f0 = lVar34;
        alVar36 = Xor(x_17,y_12);
        y_13[0] = alVar36[1];
        x_18[1] = (longlong)in_RSI;
        x_18[0] = (longlong)in_RDI;
        y_13[1] = (longlong)palVar29;
        lVar32 = local_368;
        lVar34 = lStack_360;
        alVar36 = Xor(x_18,y_13);
        y_14[0] = alVar36[1];
        x_19[1] = (longlong)in_RSI;
        x_19[0] = (longlong)in_RDI;
        y_14[1] = (longlong)palVar29;
        alVar36 = Add(x_19,y_14);
        y_15[0] = alVar36[1];
        x_20[1] = (longlong)in_RSI;
        x_20[0] = (longlong)in_RDI;
        y_15[1] = (longlong)palVar29;
        lVar33 = local_398;
        lVar35 = lStack_390;
        local_308 = lVar32;
        lStack_300 = lVar34;
        alVar36 = Xor(x_20,y_15);
        y_16[0] = alVar36[1];
        x_21[1] = (longlong)in_RSI;
        x_21[0] = (longlong)in_RDI;
        y_16[1] = (longlong)palVar29;
        alVar36 = Add(x_21,y_16);
        y_17[0] = alVar36[1];
        x_22[1] = (longlong)in_RSI;
        x_22[0] = (longlong)in_RDI;
        y_17[1] = (longlong)palVar29;
        local_318 = lVar33;
        lStack_310 = lVar35;
        alVar36 = Add(x_22,y_17);
        y_18[0] = alVar36[1];
        local_138 = local_318;
        lStack_130 = lStack_310;
        local_148 = local_2f8;
        lStack_140 = lStack_2f0;
        auVar14._8_8_ = lStack_310;
        auVar14._0_8_ = local_318;
        auVar13._8_8_ = lStack_2f0;
        auVar13._0_8_ = local_2f8;
        vpshufb_avx(auVar14,auVar13);
        x_23[1] = (longlong)in_RSI;
        x_23[0] = (longlong)in_RDI;
        y_18[1] = (longlong)palVar29;
        alVar36 = Add(x_23,y_18);
        y_19[0] = alVar36[1];
        x_24[1] = (longlong)in_RSI;
        x_24[0] = (longlong)in_RDI;
        y_19[1] = (longlong)palVar29;
        alVar36 = Add(x_24,y_19);
        y_20[0] = alVar36[1];
        x_25[1] = (longlong)in_RSI;
        x_25[0] = (longlong)in_RDI;
        y_20[1] = (longlong)palVar29;
        Add(x_25,y_20);
        local_220 = (uint)local_2b0;
        local_2c = (uint)local_2b0;
        local_30 = (uint)local_2b0;
        local_34 = (uint)local_2b0;
        local_38 = (uint)local_2b0;
        y_21[0] = (ulong)local_2b0 & 0xffffffff;
        auVar1 = vpinsrd_avx(ZEXT416((uint)local_2b0),(uint)local_2b0,1);
        auVar1 = vpinsrd_avx(auVar1,(uint)local_2b0,2);
        local_48 = vpinsrd_avx(auVar1,(uint)local_2b0,3);
        lVar32 = local_48._0_8_;
        lVar34 = local_48._8_8_;
        x_26[1] = (longlong)in_RSI;
        x_26[0] = (longlong)in_RDI;
        y_21[1]._0_4_ = (uint)local_2b0;
        y_21[1]._4_4_ = 0;
        uVar31 = (ulong)local_2b0 & 0xffffffff;
        alVar36 = Mul(x_26,y_21);
        y_22[0] = alVar36[1];
        x_27[1] = (longlong)in_RSI;
        x_27[0] = (longlong)in_RDI;
        y_22[1] = uVar31;
        Add(x_27,y_22);
        local_308 = lVar32;
        lStack_300 = lVar34;
      }
      else {
        local_3a0 = (ulong)((long)in_RSI[-1] + 0xf) / 0x50;
        local_2b0 = in_RSI + local_3a0 * -5;
        lVar32 = local_88[0];
        lVar34 = local_88[1];
        while (uVar30 = local_3a0 - 1, local_318 = lVar32, lStack_310 = lVar34, local_3a0 != 0) {
          local_3a0 = uVar30;
          Fetch128((char *)local_2a8);
          local_3b8 = lVar32;
          lStack_3b0 = lVar34;
          Fetch128((char *)(local_2a8 + 1));
          local_3c8 = lVar32;
          lStack_3c0 = lVar34;
          Fetch128((char *)(local_2a8 + 2));
          local_3d8 = lVar32;
          lStack_3d0 = lVar34;
          Fetch128((char *)(local_2a8 + 3));
          palVar29 = local_2a8 + 4;
          local_3e8 = lVar32;
          lStack_3e0 = lVar34;
          alVar36 = Fetch128((char *)palVar29);
          y_23[0] = alVar36[1];
          x_28[1] = (longlong)in_RSI;
          x_28[0] = (longlong)palVar29;
          y_23[1] = uVar30;
          local_3f8 = lVar32;
          lStack_3f0 = lVar34;
          alVar36 = Add(x_28,y_23);
          y_24[0] = alVar36[1];
          x_29[1] = (longlong)in_RSI;
          x_29[0] = (longlong)palVar29;
          y_24[1] = uVar30;
          Add(x_29,y_24);
          x_30[1] = (longlong)in_RSI;
          x_30[0] = (longlong)palVar29;
          alVar36 = Shuffle0321(x_30);
          y_25[0] = alVar36[1];
          x_31[1] = (longlong)in_RSI;
          x_31[0] = (longlong)palVar29;
          y_25[1] = uVar30;
          alVar36 = Add(x_31,y_25);
          lVar34 = lStack_3c0;
          lVar32 = local_3c8;
          y_26[0] = alVar36[1];
          x_32[1] = (longlong)in_RSI;
          x_32[0] = (longlong)palVar29;
          y_26[1] = uVar30;
          alVar36 = Mul(x_32,y_26);
          y_27[0] = alVar36[1];
          x_33[1] = (longlong)in_RSI;
          x_33[0] = (longlong)palVar29;
          y_27[1] = uVar30;
          alVar36 = Add(x_33,y_27);
          y_28[0] = alVar36[1];
          x_34[1] = (longlong)in_RSI;
          x_34[0] = (longlong)palVar29;
          y_28[1] = uVar30;
          local_408 = lVar32;
          lStack_400 = lVar34;
          alVar36 = Add(x_34,y_28);
          y_29[0] = alVar36[1];
          x_35[1] = (longlong)in_RSI;
          x_35[0] = (longlong)palVar29;
          y_29[1] = uVar30;
          alVar36 = Add(x_35,y_29);
          y_30[0] = alVar36[1];
          x_36[1] = (longlong)in_RSI;
          x_36[0] = (longlong)palVar29;
          y_30[1] = uVar30;
          alVar36 = Add(x_36,y_30);
          y_31[0] = alVar36[1];
          x_37[1] = (longlong)in_RSI;
          x_37[0] = (longlong)palVar29;
          y_31[1] = uVar30;
          Add(x_37,y_31);
          x_03[1] = in_stack_fffffffffffffaa8;
          x_03[0] = 0x2097d1;
          alVar36 = Rol17(x_03);
          y_32[0] = alVar36[1];
          x_38[1] = (longlong)in_RSI;
          x_38[0] = (longlong)palVar29;
          y_32[1] = uVar30;
          alVar36 = Mul(x_38,y_32);
          y_33[0] = alVar36[1];
          local_158 = local_308;
          lStack_150 = lStack_300;
          local_168 = local_318;
          lStack_160 = lStack_310;
          auVar12._8_8_ = lStack_300;
          auVar12._0_8_ = local_308;
          auVar11._8_8_ = lStack_310;
          auVar11._0_8_ = local_318;
          vpshufb_avx(auVar12,auVar11);
          x_39[1] = (longlong)in_RSI;
          x_39[0] = (longlong)palVar29;
          y_33[1] = uVar30;
          alVar36 = Xor(x_39,y_33);
          y_34[0] = alVar36[1];
          x_40[1] = (longlong)in_RSI;
          x_40[0] = (longlong)palVar29;
          y_34[1] = uVar30;
          lVar32 = local_3d8;
          lVar34 = lStack_3d0;
          alVar36 = Xor(x_40,y_34);
          y_35[0] = alVar36[1];
          x_41[1] = (longlong)in_RSI;
          x_41[0] = (longlong)palVar29;
          y_35[1] = uVar30;
          alVar36 = Add(x_41,y_35);
          y_36[0] = alVar36[1];
          x_42[1] = (longlong)in_RSI;
          x_42[0] = (longlong)palVar29;
          y_36[1] = uVar30;
          lVar33 = local_408;
          lVar35 = lStack_400;
          local_308 = lVar32;
          lStack_300 = lVar34;
          alVar36 = Xor(x_42,y_36);
          y_37[0] = alVar36[1];
          x_43[1] = (longlong)in_RSI;
          x_43[0] = (longlong)palVar29;
          y_37[1] = uVar30;
          Add(x_43,y_37);
          in_RDI = (longlong (*) [2])&local_318;
          in_RSI = &local_338;
          local_318 = lVar33;
          lStack_310 = lVar35;
          std::swap<long_long__vector(2)>(in_RDI,in_RSI);
          local_f8 = local_338[0];
          lStack_f0 = local_338[1];
          auVar18._8_8_ = local_338[1];
          auVar18._0_8_ = local_338[0];
          local_338 = (longlong  [2])aesimc(auVar18);
          x_44[1] = (longlong)in_RSI;
          x_44[0] = (longlong)in_RDI;
          y_38[1] = uVar30;
          y_38[0] = extraout_RDX;
          alVar36 = Add(x_44,y_38);
          y_39[0] = alVar36[1];
          local_178 = local_318;
          lStack_170 = lStack_310;
          local_188 = local_2f8;
          lStack_180 = lStack_2f0;
          auVar10._8_8_ = lStack_310;
          auVar10._0_8_ = local_318;
          auVar9._8_8_ = lStack_2f0;
          auVar9._0_8_ = local_2f8;
          vpshufb_avx(auVar10,auVar9);
          x_45[1] = (longlong)in_RSI;
          x_45[0] = (longlong)in_RDI;
          y_39[1] = uVar30;
          alVar36 = Add(x_45,y_39);
          y_40[0] = alVar36[1];
          x_46[1] = (longlong)in_RSI;
          x_46[0] = (longlong)in_RDI;
          y_40[1] = uVar30;
          alVar36 = Add(x_46,y_40);
          y_41[0] = alVar36[1];
          x_47[1] = (longlong)in_RSI;
          x_47[0] = (longlong)in_RDI;
          y_41[1] = uVar30;
          alVar36 = Add(x_47,y_41);
          y_42[0] = alVar36[1];
          x_48[1] = (longlong)in_RSI;
          x_48[0] = (longlong)in_RDI;
          y_42[1] = uVar30;
          lVar32 = local_318;
          lVar34 = lStack_310;
          Mul(x_48,y_42);
          local_2a8 = local_2a8 + 5;
        }
        uVar31 = uVar30;
        local_3a0 = uVar30;
        if (local_2b0 != (longlong (*) [2])0x0) {
          local_224 = (uint)local_2b0;
          local_4 = (uint)local_2b0;
          local_8 = (uint)local_2b0;
          local_c = (uint)local_2b0;
          local_10 = (uint)local_2b0;
          y_43[0] = (ulong)local_2b0 & 0xffffffff;
          auVar1 = vpinsrd_avx(ZEXT416((uint)local_2b0),(uint)local_2b0,1);
          auVar1 = vpinsrd_avx(auVar1,(uint)local_2b0,2);
          local_28 = vpinsrd_avx(auVar1,(uint)local_2b0,3);
          x_49[1] = (longlong)in_RSI;
          x_49[0] = (longlong)in_RDI;
          y_43[1]._0_4_ = (uint)local_2b0;
          y_43[1]._4_4_ = 0;
          uVar31 = (ulong)local_2b0 & 0xffffffff;
          Add(x_49,y_43);
          local_2a8 = (longlong (*) [2])((long)local_2b0[-5] + (long)*local_2a8);
          lVar32 = local_2f8;
          lVar34 = lStack_2f0;
          Fetch128((char *)local_2a8);
          local_418 = lVar32;
          lStack_410 = lVar34;
          Fetch128((char *)(local_2a8 + 1));
          local_428 = lVar32;
          lStack_420 = lVar34;
          Fetch128((char *)(local_2a8 + 2));
          local_438 = lVar32;
          lStack_430 = lVar34;
          Fetch128((char *)(local_2a8 + 3));
          palVar29 = local_2a8 + 4;
          local_448 = lVar32;
          lStack_440 = lVar34;
          alVar36 = Fetch128((char *)palVar29);
          y_44[0] = alVar36[1];
          x_50[1] = (longlong)in_RSI;
          x_50[0] = (longlong)palVar29;
          y_44[1] = uVar31;
          local_458 = lVar32;
          lStack_450 = lVar34;
          alVar36 = Add(x_50,y_44);
          y_45[0] = alVar36[1];
          x_51[1] = (longlong)in_RSI;
          x_51[0] = (longlong)palVar29;
          y_45[1] = uVar31;
          Add(x_51,y_45);
          x_52[1] = (longlong)in_RSI;
          x_52[0] = (longlong)palVar29;
          alVar36 = Shuffle0321(x_52);
          y_46[0] = alVar36[1];
          x_53[1] = (longlong)in_RSI;
          x_53[0] = (longlong)palVar29;
          y_46[1] = uVar31;
          alVar36 = Add(x_53,y_46);
          lVar34 = lStack_420;
          lVar32 = local_428;
          y_47[0] = alVar36[1];
          x_54[1] = (longlong)in_RSI;
          x_54[0] = (longlong)palVar29;
          y_47[1] = uVar31;
          alVar36 = Mul(x_54,y_47);
          y_48[0] = alVar36[1];
          x_55[1] = (longlong)in_RSI;
          x_55[0] = (longlong)palVar29;
          y_48[1] = uVar31;
          alVar36 = Add(x_55,y_48);
          y_49[0] = alVar36[1];
          x_56[1] = (longlong)in_RSI;
          x_56[0] = (longlong)palVar29;
          y_49[1] = uVar31;
          local_468 = lVar32;
          lStack_460 = lVar34;
          alVar36 = Add(x_56,y_49);
          y_50[0] = alVar36[1];
          x_57[1] = (longlong)in_RSI;
          x_57[0] = (longlong)palVar29;
          y_50[1] = uVar31;
          alVar36 = Add(x_57,y_50);
          y_51[0] = alVar36[1];
          x_58[1] = (longlong)in_RSI;
          x_58[0] = (longlong)palVar29;
          y_51[1] = uVar31;
          alVar36 = Add(x_58,y_51);
          y_52[0] = alVar36[1];
          x_59[1] = (longlong)in_RSI;
          x_59[0] = (longlong)palVar29;
          y_52[1] = uVar31;
          Add(x_59,y_52);
          alVar36[1] = in_stack_fffffffffffffaa8;
          alVar36[0] = 0x209c47;
          alVar36 = Rol17(alVar36);
          y_53[0] = alVar36[1];
          x_60[1] = (longlong)in_RSI;
          x_60[0] = (longlong)palVar29;
          y_53[1] = uVar31;
          alVar36 = Mul(x_60,y_53);
          y_54[0] = alVar36[1];
          local_198 = local_308;
          lStack_190 = lStack_300;
          local_1a8 = local_318;
          lStack_1a0 = lStack_310;
          auVar8._8_8_ = lStack_300;
          auVar8._0_8_ = local_308;
          auVar7._8_8_ = lStack_310;
          auVar7._0_8_ = local_318;
          vpshufb_avx(auVar8,auVar7);
          x_61[1] = (longlong)in_RSI;
          x_61[0] = (longlong)palVar29;
          y_54[1] = uVar31;
          alVar36 = Xor(x_61,y_54);
          y_55[0] = alVar36[1];
          x_62[1] = (longlong)in_RSI;
          x_62[0] = (longlong)palVar29;
          y_55[1] = uVar31;
          lVar32 = local_438;
          lVar34 = lStack_430;
          alVar36 = Xor(x_62,y_55);
          y_56[0] = alVar36[1];
          x_63[1] = (longlong)in_RSI;
          x_63[0] = (longlong)palVar29;
          y_56[1] = uVar31;
          alVar36 = Add(x_63,y_56);
          y_57[0] = alVar36[1];
          x_64[1] = (longlong)in_RSI;
          x_64[0] = (longlong)palVar29;
          y_57[1] = uVar31;
          lVar33 = local_468;
          lVar35 = lStack_460;
          local_308 = lVar32;
          lStack_300 = lVar34;
          alVar36 = Xor(x_64,y_57);
          y_58[0] = alVar36[1];
          x_65[1] = (longlong)in_RSI;
          x_65[0] = (longlong)palVar29;
          y_58[1] = uVar31;
          Add(x_65,y_58);
          in_RDI = (longlong (*) [2])&local_318;
          in_RSI = &local_338;
          local_318 = lVar33;
          lStack_310 = lVar35;
          std::swap<long_long__vector(2)>(in_RDI,in_RSI);
          local_108 = local_338[0];
          lStack_100 = local_338[1];
          auVar17._8_8_ = local_338[1];
          auVar17._0_8_ = local_338[0];
          local_338 = (longlong  [2])aesimc(auVar17);
          x_66[1] = (longlong)in_RSI;
          x_66[0] = (longlong)in_RDI;
          y_59[1] = uVar31;
          y_59[0] = extraout_RDX_00;
          alVar36 = Add(x_66,y_59);
          y_60[0] = alVar36[1];
          local_1b8 = local_318;
          lStack_1b0 = lStack_310;
          local_1c8 = local_2f8;
          lStack_1c0 = lStack_2f0;
          auVar6._8_8_ = lStack_310;
          auVar6._0_8_ = local_318;
          auVar1._8_8_ = lStack_2f0;
          auVar1._0_8_ = local_2f8;
          vpshufb_avx(auVar6,auVar1);
          x_67[1] = (longlong)in_RSI;
          x_67[0] = (longlong)in_RDI;
          y_60[1] = uVar31;
          alVar36 = Add(x_67,y_60);
          y_61[0] = alVar36[1];
          x_68[1] = (longlong)in_RSI;
          x_68[0] = (longlong)in_RDI;
          y_61[1] = uVar31;
          alVar36 = Add(x_68,y_61);
          y_62[0] = alVar36[1];
          x_69[1] = (longlong)in_RSI;
          x_69[0] = (longlong)in_RDI;
          y_62[1] = uVar31;
          alVar36 = Add(x_69,y_62);
          y_63[0] = alVar36[1];
          x_70[1] = (longlong)in_RSI;
          x_70[0] = (longlong)in_RDI;
          y_63[1] = uVar31;
          Mul(x_70,y_63);
        }
      }
      x_71[1] = (longlong)in_RSI;
      x_71[0] = (longlong)in_RDI;
      alVar36 = Shuffle0321(x_71);
      y_64[0] = alVar36[1];
      x_72[1] = (longlong)in_RSI;
      x_72[0] = (longlong)in_RDI;
      y_64[1] = uVar31;
      alVar36 = Xor(x_72,y_64);
      y_65[0] = alVar36[1];
      x_73[1] = (longlong)in_RSI;
      x_73[0] = (longlong)in_RDI;
      y_65[1] = uVar31;
      alVar36 = Xor(x_73,y_65);
      y_66[0] = alVar36[1];
      x_74[1] = (longlong)in_RSI;
      x_74[0] = (longlong)in_RDI;
      y_66[1] = uVar31;
      alVar36 = Xor(x_74,y_66);
      y_67[0] = alVar36[1];
      x_75[1] = (longlong)in_RSI;
      x_75[0] = (longlong)in_RDI;
      y_67[1] = uVar31;
      alVar36 = Mul(x_75,y_67);
      y_68[0] = alVar36[1];
      x_76[1] = (longlong)in_RSI;
      x_76[0] = (longlong)in_RDI;
      y_68[1] = uVar31;
      alVar36 = Mul(x_76,y_68);
      y_69[0] = alVar36[1];
      x_77[1] = (longlong)in_RSI;
      x_77[0] = (longlong)in_RDI;
      y_69[1] = uVar31;
      alVar36 = Mul(x_77,y_69);
      y_70[0] = alVar36[1];
      x_78[1] = (longlong)in_RSI;
      x_78[0] = (longlong)in_RDI;
      y_70[1] = uVar31;
      alVar36 = Mul(x_78,y_70);
      y_71[0] = alVar36[1];
      local_1d8 = local_308;
      lStack_1d0 = lStack_300;
      local_1e8 = local_318;
      lStack_1e0 = lStack_310;
      auVar5._8_8_ = lStack_300;
      auVar5._0_8_ = local_308;
      auVar4._8_8_ = lStack_310;
      auVar4._0_8_ = local_318;
      vpshufb_avx(auVar5,auVar4);
      x_79[1] = (longlong)in_RSI;
      x_79[0] = (longlong)in_RDI;
      y_71[1] = uVar31;
      alVar36 = Add(x_79,y_71);
      y_72[0] = alVar36[1];
      x_80[1] = (longlong)in_RSI;
      x_80[0] = (longlong)in_RDI;
      y_72[1] = uVar31;
      alVar36 = Add(x_80,y_72);
      y_73[0] = alVar36[1];
      x_81[1] = (longlong)in_RSI;
      x_81[0] = (longlong)in_RDI;
      y_73[1] = uVar31;
      alVar36 = Add(x_81,y_73);
      y_74[0] = alVar36[1];
      x_82[1] = (longlong)in_RSI;
      x_82[0] = (longlong)in_RDI;
      y_74[1] = uVar31;
      alVar36 = Add(x_82,y_74);
      y_75[0] = alVar36[1];
      x_83[1] = (longlong)in_RSI;
      x_83[0] = (longlong)in_RDI;
      y_75[1] = uVar31;
      alVar36 = Add(x_83,y_75);
      y_76[0] = alVar36[1];
      local_1f8 = local_318;
      lStack_1f0 = lStack_310;
      local_208 = local_2f8;
      lStack_200 = lStack_2f0;
      auVar3._8_8_ = lStack_310;
      auVar3._0_8_ = local_318;
      auVar2._8_8_ = lStack_2f0;
      auVar2._0_8_ = local_2f8;
      vpshufb_avx(auVar3,auVar2);
      x_84[1] = (longlong)in_RSI;
      x_84[0] = (longlong)in_RDI;
      y_76[1] = uVar31;
      Xor(x_84,y_76);
      local_4a8 = local_318;
      lStack_4a0 = lStack_310;
      local_498 = local_308;
      lStack_490 = lStack_300;
      local_478 = local_2f8;
      lStack_470 = lStack_2f0;
      local_2a8 = (longlong (*) [2])&local_4a8;
      local_488 = local_328;
      lStack_480 = lStack_320;
      uVar19 = util::Fetch32((char *)local_2a8);
      uVar20 = util::Fetch32((char *)((long)local_2a8 + 4));
      uVar21 = util::Fetch32((char *)((long)local_2a8 + 8));
      local_23c = util::Fetch32((char *)((long)local_2a8 + 0xc));
      uVar22 = crc32(uVar19,local_23c);
      local_238 = uVar19;
      local_244 = util::Fetch32((char *)((long)local_2a8 + 0x10));
      iVar23 = crc32(uVar20,local_244);
      local_240 = uVar20;
      local_24c = util::Fetch32((char *)((long)local_2a8 + 0x14));
      uVar24 = crc32(uVar21 * -0x3361d2af,local_24c);
      local_248 = uVar21 * -0x3361d2af;
      local_254 = util::Fetch32((char *)((long)local_2a8 + 0x18));
      iVar25 = crc32(uVar22,local_254);
      iVar23 = iVar23 * -0x3361d2af;
      local_250 = uVar22;
      local_25c = util::Fetch32((char *)((long)local_2a8 + 0x1c));
      iVar26 = crc32(iVar23,local_25c);
      local_258 = iVar23;
      local_264 = util::Fetch32((char *)((long)local_2a8 + 0x20));
      iVar27 = crc32(uVar24,local_264);
      iVar25 = iVar25 * -0x3361d2af;
      local_260 = uVar24;
      local_26c = util::Fetch32((char *)((long)local_2a8 + 0x24));
      uVar22 = crc32(iVar25,local_26c);
      iVar23 = iVar26;
      local_268 = iVar25;
      local_274 = util::Fetch32((char *)((long)local_2a8 + 0x28));
      iVar25 = crc32(iVar23,local_274);
      iVar27 = iVar27 * -0x3361d2af;
      local_270 = iVar23;
      local_27c = util::Fetch32((char *)((long)local_2a8 + 0x2c));
      uVar24 = crc32(iVar27,local_27c);
      local_278 = iVar27;
      local_284 = util::Fetch32((char *)((long)local_2a8 + 0x30));
      uVar28 = crc32(uVar22,local_284);
      local_280 = uVar22;
      local_28c = util::Fetch32((char *)((long)local_2a8 + 0x34));
      iVar23 = crc32(iVar25 * -0x3361d2af,local_28c);
      local_288 = iVar25 * -0x3361d2af;
      local_294 = util::Fetch32((char *)((long)local_2a8 + 0x38));
      iVar25 = crc32(uVar24,local_294);
      local_290 = uVar24;
      uVar19 = util::Fetch32((char *)((long)local_2a8 + 0x3c));
      iVar27 = crc32(uVar28,uVar19);
      local_2a0 = (((iVar26 - iVar27) + iVar23) - iVar25) * -0x3361d2af;
    }
  }
  return local_2a0;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  const uint32_t seed = 81;
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ?
         farmhashmk::Hash32Len0to4(s, len) :
         farmhashmk::Hash32Len5to12(s, len)) :
        farmhashmk::Hash32Len13to24(s, len);
  }

  if (len < 40) {
    uint32_t a = len, b = seed * c2, c = a + b;
    a += Fetch(s + len - 4);
    b += Fetch(s + len - 20);
    c += Fetch(s + len - 16);
    uint32_t d = a;
    a = NAMESPACE_FOR_HASH_FUNCTIONS::Rotate32(a, 21);
    a = Mur(a, Mur(b, _mm_crc32_u32(c, d)));
    a += Fetch(s + len - 12);
    b += Fetch(s + len - 8);
    d += a;
    a += d;
    b = Mur(b, d) * c2;
    a = _mm_crc32_u32(a, b + c);
    return farmhashmk::Hash32Len13to24(s, (len + 1) / 2, a) + b;
  }

#undef Mulc1
#define Mulc1(x) Mul((x), cc1)

#undef Mulc2
#define Mulc2(x) Mul((x), cc2)

#undef Murk
#define Murk(a, h)                              \
  Add(k,                                        \
      Mul5(                                     \
          Rol19(                                \
              Xor(                              \
                  Mulc2(                        \
                      Rol17(                    \
                          Mulc1(a))),           \
                  (h)))))

  const __m128i cc1 = _mm_set1_epi32(c1);
  const __m128i cc2 = _mm_set1_epi32(c2);
  __m128i h = _mm_set1_epi32(seed);
  __m128i g = _mm_set1_epi32(c1 * seed);
  __m128i f = g;
  __m128i k = _mm_set1_epi32(0xe6546b64);
  __m128i q;
  if (len < 80) {
    __m128i a = Fetch128(s);
    __m128i b = Fetch128(s + 16);
    __m128i c = Fetch128(s + (len - 15) / 2);
    __m128i d = Fetch128(s + len - 32);
    __m128i e = Fetch128(s + len - 16);
    h = Add(h, a);
    g = Add(g, b);
    q = g;
    g = Shuffle0321(g);
    f = Add(f, c);
    __m128i be = Add(b, Mulc1(e));
    h = Add(h, f);
    f = Add(f, h);
    h = Add(Murk(d, h), e);
    k = Xor(k, _mm_shuffle_epi8(g, f));
    g = Add(Xor(c, g), a);
    f = Add(Xor(be, f), d);
    k = Add(k, be);
    k = Add(k, _mm_shuffle_epi8(f, h));
    f = Add(f, g);
    g = Add(g, f);
    g = Add(_mm_set1_epi32(len), Mulc1(g));
  } else {
    // len >= 80
    // The following is loosely modelled after farmhashmk::Hash32.
    size_t iters = (len - 1) / 80;
    len -= iters * 80;

#undef Chunk
#define Chunk() do {                            \
  __m128i a = Fetch128(s);                      \
  __m128i b = Fetch128(s + 16);                 \
  __m128i c = Fetch128(s + 32);                 \
  __m128i d = Fetch128(s + 48);                 \
  __m128i e = Fetch128(s + 64);                 \
  h = Add(h, a);                                \
  g = Add(g, b);                                \
  g = Shuffle0321(g);                           \
  f = Add(f, c);                                \
  __m128i be = Add(b, Mulc1(e));                \
  h = Add(h, f);                                \
  f = Add(f, h);                                \
  h = Add(h, d);                                \
  q = Add(q, e);                                \
  h = Rol17(h);                                 \
  h = Mulc1(h);                                 \
  k = Xor(k, _mm_shuffle_epi8(g, f));           \
  g = Add(Xor(c, g), a);                        \
  f = Add(Xor(be, f), d);                       \
  std::swap(f, q);                              \
  q = _mm_aesimc_si128(q);                      \
  k = Add(k, be);                               \
  k = Add(k, _mm_shuffle_epi8(f, h));           \
  f = Add(f, g);                                \
  g = Add(g, f);                                \
  f = Mulc1(f);                                 \
} while (0)

    q = g;
    while (iters-- != 0) {
      Chunk();
      s += 80;
    }

    if (len != 0) {
      h = Add(h, _mm_set1_epi32(len));
      s = s + len - 80;
      Chunk();
    }
  }

  g = Shuffle0321(g);
  k = Xor(k, g);
  k = Xor(k, q);
  h = Xor(h, q);
  f = Mulc1(f);
  k = Mulc2(k);
  g = Mulc1(g);
  h = Mulc2(h);
  k = Add(k, _mm_shuffle_epi8(g, f));
  h = Add(h, f);
  f = Add(f, h);
  g = Add(g, k);
  k = Add(k, g);
  k = Xor(k, _mm_shuffle_epi8(f, h));
  __m128i buf[4];
  buf[0] = f;
  buf[1] = g;
  buf[2] = k;
  buf[3] = h;
  s = reinterpret_cast<char*>(buf);
  uint32_t x = Fetch(s);
  uint32_t y = Fetch(s+4);
  uint32_t z = Fetch(s+8);
  x = _mm_crc32_u32(x, Fetch(s+12));
  y = _mm_crc32_u32(y, Fetch(s+16));
  z = _mm_crc32_u32(z * c1, Fetch(s+20));
  x = _mm_crc32_u32(x, Fetch(s+24));
  y = _mm_crc32_u32(y * c1, Fetch(s+28));
  uint32_t o = y;
  z = _mm_crc32_u32(z, Fetch(s+32));
  x = _mm_crc32_u32(x * c1, Fetch(s+36));
  y = _mm_crc32_u32(y, Fetch(s+40));
  z = _mm_crc32_u32(z * c1, Fetch(s+44));
  x = _mm_crc32_u32(x, Fetch(s+48));
  y = _mm_crc32_u32(y * c1, Fetch(s+52));
  z = _mm_crc32_u32(z, Fetch(s+56));
  x = _mm_crc32_u32(x, Fetch(s+60));
  return (o - x + y - z) * c1;
}